

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

lua_Integer luaV_mod(lua_State *L,lua_Integer m,lua_Integer n)

{
  lua_State *local_30;
  lua_Integer r;
  lua_Integer n_local;
  lua_Integer m_local;
  lua_State *L_local;
  
  if (n + 1U < 2) {
    if (n == 0) {
      luaG_runerror(L,"attempt to perform \'n%%0\'");
    }
    L_local = (lua_State *)0x0;
  }
  else {
    local_30 = (lua_State *)(m % n);
    if ((local_30 != (lua_State *)0x0) && ((long)((ulong)local_30 ^ n) < 0)) {
      local_30 = (lua_State *)((long)&local_30->next + n);
    }
    L_local = local_30;
  }
  return (lua_Integer)L_local;
}

Assistant:

lua_Integer luaV_mod (lua_State *L, lua_Integer m, lua_Integer n) {
  if (l_unlikely(l_castS2U(n) + 1u <= 1u)) {  /* special cases: -1 or 0 */
    if (n == 0)
      luaG_runerror(L, "attempt to perform 'n%%0'");
    return 0;   /* m % -1 == 0; avoid overflow with 0x80000...%-1 */
  }
  else {
    lua_Integer r = m % n;
    if (r != 0 && (r ^ n) < 0)  /* 'm/n' would be non-integer negative? */
      r += n;  /* correct result for different rounding */
    return r;
  }
}